

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

_Bool get_phys_addr_aarch64
                (CPUARMState_conflict *env,target_ulong address,MMUAccessType access_type,
                ARMMMUIdx mmu_idx,hwaddr *phys_ptr,MemTxAttrs *attrs,int *prot,
                target_ulong *page_size,ARMMMUFaultInfo_conflict1 *fi,ARMCacheAttrs *cacheattrs)

{
  CPUState *cs;
  MemTxAttrs MVar1;
  uc_struct_conflict2 *puVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint uVar5;
  _Bool _Var6;
  undefined1 uVar7;
  _Bool _Var8;
  byte bVar9;
  uint32_t uVar10;
  uint uVar11;
  int iVar12;
  uint32_t uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ARMCacheAttrs *cacheattrs_00;
  TCR *pTVar17;
  target_ulong tVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  ARMFaultType AVar22;
  ulong uVar23;
  uint uVar24;
  ARMCacheAttrs AVar25;
  uint uVar26;
  int ap;
  uint uVar27;
  byte bVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  char *file;
  uint uVar32;
  int iVar33;
  CPUARMState_conflict *env_00;
  bool bVar34;
  uint local_70;
  hwaddr ipa;
  CPUState *local_48;
  uint local_40;
  uint local_3c;
  ARMCacheAttrs cacheattrs2;
  int s2_prot;
  
  env_00 = (CPUARMState_conflict *)(ulong)mmu_idx;
  uVar15 = (ulong)(mmu_idx - ARMMMUIdx_E10_0);
  if (0x37 < mmu_idx - ARMMMUIdx_E10_0) goto LAB_00616aea;
  puVar2 = env->uc;
  uVar20 = 0;
  if ((0xf000000070872U >> (uVar15 & 0x3f) & 1) == 0) {
    if ((0xf0000000000780U >> (uVar15 & 0x3f) & 1) == 0) {
      if ((0xdUL >> (uVar15 & 0x3f) & 1) != 0) {
        if ((env->features & 0x100000000) == 0) {
          uVar7 = (*(code *)(&DAT_00d73128 + *(int *)(&DAT_00d73128 + uVar15 * 4)))();
          return (_Bool)uVar7;
        }
        cacheattrs2 = (ARMCacheAttrs)0x0;
        if (mmu_idx == ARMMMUIdx_E10_0) {
          mmu_idx = ARMMMUIdx_Stage1_E0;
        }
        else if (mmu_idx == ARMMMUIdx_E10_1_PAN) {
          mmu_idx = ARMMMUIdx_Stage1_E1_PAN;
        }
        else if (mmu_idx == ARMMMUIdx_E10_1) {
          mmu_idx = ARMMMUIdx_Stage1_E1;
        }
        _Var6 = get_phys_addr_aarch64
                          (env,address,access_type,mmu_idx,&ipa,attrs,prot,page_size,fi,cacheattrs);
        if (!_Var6) {
          if ((env->features & 0x200) == 0) {
            if (((env->cp15).hcr_el2 & 0x1001) == 0) goto LAB_00615e5d;
          }
          else if ((~(env->v7m).mpu_ctrl[0] & 3) != 0) goto LAB_00615e5d;
          cacheattrs_00 = &cacheattrs2;
          if (cacheattrs == (ARMCacheAttrs *)0x0) {
            cacheattrs_00 = (ARMCacheAttrs *)0x0;
          }
          _Var6 = get_phys_addr_lpae(env,CONCAT44(ipa._4_4_,(uint)ipa),access_type,ARMMMUIdx_Stage2,
                                     phys_ptr,attrs,&s2_prot,page_size,fi,cacheattrs_00);
          fi->s2addr = CONCAT44(ipa._4_4_,(uint)ipa);
          *prot = *prot & s2_prot;
          if (cacheattrs != (ARMCacheAttrs *)0x0 && !_Var6) {
            if (((env->cp15).hcr_el2 & 0x1000) != 0) {
              *(ushort *)cacheattrs = SUB42(*cacheattrs,0) & 0xfc00 | 0xff;
            }
            AVar25 = *cacheattrs;
            uVar11 = (uint)AVar25 >> 4 & 0xf;
            bVar19 = (byte)uVar11;
            uVar14 = (uint)cacheattrs2 >> 4 & 0xf;
            uVar24 = (uint)AVar25 >> 8 & 3;
            uVar20 = 0x200;
            if ((uVar24 != 2) && (uVar26 = (uint)cacheattrs2 >> 8 & 3, uVar26 != 2)) {
              uVar20 = 0;
              if (uVar26 == 3) {
                uVar20 = 0x300;
              }
              if (uVar24 == 3) {
                uVar20 = 0x300;
              }
            }
            uVar24 = (uint)AVar25 & 0xf;
            bVar9 = (byte)uVar24;
            uVar26 = (uint)cacheattrs2 & 0xf;
            if (uVar14 == 0 || uVar11 == 0) {
              AVar25 = (ARMCacheAttrs)0x200;
              if ((uVar26 != 0 && uVar24 != 0) &&
                 (AVar25 = (ARMCacheAttrs)0x204, uVar26 != 4 && uVar24 != 4)) {
                AVar25 = (ARMCacheAttrs)((uint)(uVar26 != 8 && uVar24 != 8) * 4 + 0x208);
              }
            }
            else {
              bVar28 = 4;
              if (((uVar14 != 4 && uVar11 != 4) && (bVar28 = bVar19, (bVar19 >> 2 & 1) != 0)) &&
                 (((uint)cacheattrs2 & 0xc0) == 0x80)) {
                bVar28 = bVar19 & 3 | 8;
              }
              bVar19 = 4;
              if (((uVar26 != 4 && uVar24 != 4) && (bVar19 = bVar9, (uVar24 >> 2 & 1) != 0)) &&
                 (((uint)cacheattrs2 & 0xc) == 8)) {
                bVar19 = bVar9 & 3 | 8;
              }
              bVar19 = bVar19 | bVar28 << 4;
              AVar25 = (ARMCacheAttrs)0x244;
              if (bVar19 != 0x44) {
                AVar25 = (ARMCacheAttrs)(uVar20 | bVar19);
              }
            }
            *cacheattrs = AVar25;
            return false;
          }
          return _Var6;
        }
LAB_00615e5d:
        *phys_ptr = CONCAT44(ipa._4_4_,(uint)ipa);
        return _Var6;
      }
      goto LAB_00616aea;
    }
    uVar20 = 2;
  }
  MVar1 = *attrs;
  *attrs = (MemTxAttrs)((uint)MVar1 & 0xfffffffd | uVar20);
  uVar11 = 0;
  uVar24 = mmu_idx - ARMMMUIdx_E20_0;
  if (uVar24 < 0x36) {
    if ((0x2a800000008041U >> ((ulong)uVar24 & 0x3f) & 1) != 0) {
      uVar11 = 4;
      goto LAB_0061551b;
    }
    if ((6UL >> ((ulong)uVar24 & 0x3f) & 1) == 0) goto LAB_0061551b;
LAB_00615bdc:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
    ;
    iVar12 = 0x2386;
LAB_00616af6:
    g_assertion_message_expr(file,iVar12,(char *)0x0);
  }
LAB_0061551b:
  *attrs = (MemTxAttrs)((uint)MVar1 & 0xfffffff9 | uVar20 | uVar11);
  if ((mmu_idx != ARMMMUIdx_Stage2 && address < 0x2000000) && ((env->features & 0x8000000) == 0)) {
    uVar10 = regime_el(env,mmu_idx);
    address = address + (&(env->cp15).field_38.fcseidr_ns)[uVar10 == 3];
  }
  uVar20 = (uint)address;
  if ((env->features & 0x80) == 0) {
    _Var6 = regime_translation_disabled(env,mmu_idx);
    if (_Var6) {
      if (mmu_idx == ARMMMUIdx_Stage2) goto LAB_006157bd;
      uVar10 = regime_el(env,mmu_idx);
      uVar15 = env->features;
      uVar23 = uVar15 & 0x10000000;
      if (uVar10 != 3) {
        uVar23 = 0;
        if ((uVar15 & 0x200000000) == 0) {
          uVar23 = (ulong)(((uint)uVar15 & 0x10000000) >> 0x1c);
        }
        if ((~uVar15 & 0x210000000) == 0) {
          uVar23 = (ulong)((uint)(env->cp15).scr_el3 >> 10);
        }
        if (((uVar10 != 2) && ((uVar15 >> 0x20 & 1) != 0)) &&
           (((uVar15 & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)))) {
          if ((uVar23 & 1) == 0) goto LAB_006157bd;
          uVar23 = (env->cp15).hcr_el2 >> 0x1f;
        }
        uVar23 = uVar23 & 1;
      }
      if (uVar23 == 0) goto LAB_006157bd;
      uVar15 = (ulong)((uint)env[1].xregs[0x14] & 0xf);
      if (5 < uVar15) {
        __assert_fail("parange < ARRAY_SIZE(pamax_map)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
                      ,0xf7,"unsigned int arm_pamax(ARMCPU *)");
      }
      uVar23 = (env->cp15).tcr_el[uVar10].raw_tcr;
      uVar20 = (uint)(uVar23 >> 0x20);
      if (mmu_idx < 0x23) {
        if ((0x703ee0000U >> ((ulong)env_00 & 0x3f) & 1) == 0) {
          uVar11 = 0;
          if (env_00 != (CPUARMState_conflict *)0x1b) goto LAB_0061621a;
        }
        else {
          uVar11 = uVar20 >> 5;
        }
      }
      else {
LAB_0061621a:
        uVar11 = ((uint)(uVar23 >> 0x14) & 1) * 3;
      }
      if (access_type == MMU_INST_FETCH) {
        if (mmu_idx < 0x23) {
          if ((0x703ee0000U >> ((ulong)env_00 & 0x3f) & 1) == 0) {
            uVar20 = 0;
            if (env_00 != (CPUARMState_conflict *)0x1b) goto LAB_006163f5;
          }
          else {
            uVar20 = uVar20 >> 0x13;
          }
        }
        else {
LAB_006163f5:
          uVar20 = ((uint)uVar23 >> 0x1d & 1) * 3;
        }
        uVar11 = uVar11 & ~uVar20;
      }
      iVar12 = ((uint)((uVar11 >> ((uint)(address >> 0x37) & 1) & 1) == 0) * 8 + 0x37) -
               *(int *)(arm_pamax_pamax_map + uVar15 * 4);
      if (iVar12 < 0) {
        __assert_fail("start >= 0 && length > 0 && length <= 64 - start",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                      ,0x158,"uint64_t extract64(uint64_t, int, int)");
      }
      if ((address >> ((byte)*(int *)(arm_pamax_pamax_map + uVar15 * 4) & 0x3f)) <<
          (~(byte)iVar12 & 0x3f) != 0) {
        fi->type = ARMFault_AddressSize;
        fi->level = 0;
        fi->stage2 = false;
        return true;
      }
      address = address & 0xfffffffffffff;
LAB_006157bd:
      *phys_ptr = address;
      *prot = 7;
      *page_size = puVar2->init_target_page->mask * -0x100000000 >> 0x20;
      return false;
    }
    uVar10 = regime_el(env,mmu_idx);
    if (uVar10 == 2) goto LAB_006156b3;
    uVar15 = env->features;
    uVar23 = uVar15 & 0x10000000;
    if (uVar10 == 3) {
joined_r0x00615aac:
      if (uVar23 != 0) goto LAB_006156b3;
    }
    else {
      uVar11 = 0;
      if ((uVar15 & 0x200000000) == 0) {
        uVar11 = ((uint)uVar15 & 0x10000000) >> 0x1c;
      }
      if ((~uVar15 & 0x210000000) == 0) {
        uVar11 = (uint)(env->cp15).scr_el3 >> 10;
      }
      uVar23 = (ulong)uVar11;
      if (((uVar15 >> 0x20 & 1) == 0) ||
         (((uVar15 & 0x200000000) != 0 && (((env->cp15).scr_el3 & 1) == 0)))) {
LAB_00615aaa:
        uVar23 = uVar23 & 1;
        goto joined_r0x00615aac;
      }
      if ((uVar11 & 1) != 0) {
        uVar23 = (env->cp15).hcr_el2 >> 0x1f;
        goto LAB_00615aaa;
      }
    }
    if (((uint)uVar15 >> 0x1a & 1) != 0) {
      if (mmu_idx == ARMMMUIdx_Stage2) {
        pTVar17 = &(env->cp15).vtcr_el2;
      }
      else {
        uVar10 = regime_el(env,mmu_idx);
        pTVar17 = (env->cp15).tcr_el + uVar10;
      }
      if ((pTVar17->raw_tcr & 0x80000000) != 0) {
LAB_006156b3:
        _Var6 = get_phys_addr_lpae(env,address,access_type,mmu_idx,phys_ptr,attrs,prot,page_size,fi,
                                   cacheattrs);
        return _Var6;
      }
    }
    uVar10 = regime_el(env,mmu_idx);
    cs = (CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14);
    if ((*(byte *)((long)(env->cp15).cptr_el + (ulong)uVar10 * 8 + -0x26) & 0x80) != 0) {
      _Var6 = get_level1_table_address(env,mmu_idx,(uint32_t *)&ipa,uVar20);
      AVar22 = ARMFault_Translation;
      if (!_Var6) {
        iVar12 = 1;
        uVar11 = 0;
        goto LAB_0061647b;
      }
      uVar24 = mmu_idx - ARMMMUIdx_E20_0;
      uVar15 = (ulong)uVar24;
      local_48 = cs;
      if ((0x36 < uVar24) || ((0x7f8000000387ffU >> (uVar15 & 0x3f) & 1) == 0)) goto LAB_00616aea;
      uVar10 = arm_ldl_ptw(cs,(ulong)(uint)ipa,(0x787ffffffc7bc0U >> (uVar15 & 0x3f) & 1) != 0,
                           mmu_idx,fi);
      if (fi->type != ARMFault_None) {
        uVar11 = 0;
        iVar12 = 1;
        goto LAB_0061647f;
      }
      uVar14 = uVar10 & 3;
      AVar22 = ARMFault_Translation;
      iVar12 = 1;
      if (uVar14 == 0) {
        uVar11 = 0;
      }
      else if ((uVar14 != 3) || (uVar11 = 0, (env->features & 0x2000000) != 0)) {
        uVar11 = uVar10 >> 5 & 0xf;
        uVar26 = 0;
        if ((uVar10 >> 0x12 & 1) == 0) {
          uVar26 = uVar11;
        }
        if (uVar14 == 1) {
          uVar26 = uVar10 >> 5 & 0xf;
        }
        local_70 = uVar10 & 3;
        uVar13 = regime_el(env,mmu_idx);
        uVar27 = *(uint32_t *)((long)((env->cp15).tcr_el + 5) + ((ulong)(uVar13 != 1) * 2 + 2) * 4);
        iVar33 = (uVar14 == 1) + 1;
        uVar14 = uVar27 >> (sbyte)(uVar26 * 2);
        if ((uVar27 >> uVar26 * 2 & 1) == 0) {
          AVar22 = ARMFault_Domain;
          iVar12 = iVar33;
          uVar11 = uVar26;
        }
        else {
          if (local_70 == 1) {
            local_40 = 0;
            if ((env->features & 0x2000000) != 0) {
              local_40 = uVar10 >> 2 & 1;
            }
            local_3c = uVar14;
            if ((0x36 < uVar24) || ((0x7f8000000387ffU >> (uVar15 & 0x3f) & 1) == 0))
            goto LAB_00616aea;
            uVar13 = arm_ldl_ptw(local_48,(ulong)((uint)(address >> 10) & 0x3fc |
                                                 uVar10 & 0xfffffc00),
                                 (0x787ffffffc7bc0U >> (uVar15 & 0x3f) & 1) != 0,mmu_idx,fi);
            iVar12 = 2;
            if (fi->type != ARMFault_None) goto LAB_0061647f;
            uVar27 = uVar10 >> 3;
            uVar30 = uVar13 >> 7 & 4 | uVar13 >> 4 & 3;
            if ((uVar13 & 3) - 2 < 2) {
              uVar20 = uVar20 & 0xfff | uVar13 & 0xfffff000;
              uVar11 = uVar13 & 1;
              *page_size = 0x1000;
            }
            else {
              AVar22 = ARMFault_Translation;
              iVar12 = 2;
              if ((uVar13 & 3) == 0) goto LAB_0061647b;
              uVar20 = uVar20 & 0xffff | uVar13 & 0xffff0000;
              uVar11 = uVar13 & 0x8000;
              *page_size = 0x10000;
            }
            uVar23 = (ulong)uVar20;
            uVar14 = local_3c;
            uVar20 = local_40;
          }
          else {
            if ((uVar10 >> 0x12 & 1) == 0) {
              uVar23 = (ulong)(uVar20 & 0xfffff | uVar10 & 0xfff00000);
              tVar18 = 0x100000;
            }
            else {
              uVar23 = (ulong)uVar11 << 0x24 |
                       CONCAT44(uVar10 >> 0x14,uVar20 & 0xffffff | uVar10 & 0xff000000) &
                       0xfffffffff;
              tVar18 = 0x1000000;
            }
            *page_size = tVar18;
            uVar30 = uVar10 >> 0xd & 4 | uVar10 >> 10 & 3;
            uVar11 = uVar10 & 0x10;
            uVar20 = uVar10 & 1;
            uVar27 = uVar10 >> 0x13;
          }
          if ((uVar14 & 3) == 3) {
            *prot = 7;
            goto LAB_006169e0;
          }
          uVar29 = uVar11;
          if ((((uVar20 != 0) && (uVar29 = 1, uVar24 < 0x36)) &&
              (uVar29 = uVar11, (0x2a800000008041U >> (uVar15 & 0x3f) & 1) == 0)) &&
             (uVar29 = 1, (6UL >> (uVar15 & 0x3f) & 1) != 0)) goto LAB_00615bdc;
          AVar22 = ARMFault_Permission;
          if ((access_type != MMU_INST_FETCH) || (iVar12 = iVar33, uVar11 = uVar26, uVar29 == 0)) {
            if (((env->features & 0x10) == 0) ||
               (uVar10 = regime_el(env,mmu_idx),
               (*(byte *)((long)(env->cp15).cptr_el + (ulong)uVar10 * 8 + -0x25) & 0x20) == 0)) {
              uVar20 = ap_to_rw_prot(env,mmu_idx,uVar30,uVar14 & 3);
            }
            else {
              if ((uVar30 & 1) == 0) {
                AVar22 = ARMFault_AccessFlag;
                iVar12 = iVar33;
                uVar11 = uVar26;
                goto LAB_0061647b;
              }
              uVar20 = simple_ap_to_rw_prot(env_00,uVar30 >> 1,ap);
            }
            uVar24 = uVar20 | 4;
            if (uVar20 == 0) {
              uVar24 = uVar20;
            }
            if (uVar29 != 0) {
              uVar24 = uVar20;
            }
            *prot = uVar24;
            AVar22 = ARMFault_Permission;
            iVar12 = iVar33;
            uVar11 = uVar26;
            if ((uVar24 >> (access_type & 0x1f) & 1) != 0) {
LAB_006169e0:
              if ((uVar27 & 1) != 0) {
                *(byte *)attrs = *(byte *)attrs & 0xfd;
              }
              *phys_ptr = uVar23;
              return false;
            }
          }
        }
      }
LAB_0061647b:
      fi->type = AVar22;
LAB_0061647f:
      fi->domain = uVar11;
      fi->level = iVar12;
      return true;
    }
    _Var6 = get_level1_table_address(env,mmu_idx,(uint32_t *)&ipa,uVar20);
    AVar22 = ARMFault_Translation;
    if (_Var6) {
      uVar24 = mmu_idx - ARMMMUIdx_E20_0;
      uVar15 = (ulong)uVar24;
      if ((0x36 < uVar24) || ((0x7f8000000387ffU >> (uVar15 & 0x3f) & 1) == 0)) {
LAB_00616aea:
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
        ;
        iVar12 = 0x37c;
        goto LAB_00616af6;
      }
      uVar10 = arm_ldl_ptw(cs,(ulong)(uint)ipa,(0x787ffffffc7bc0U >> (uVar15 & 0x3f) & 1) != 0,
                           mmu_idx,fi);
      if (fi->type != ARMFault_None) {
        uVar11 = 0;
        iVar12 = 1;
        goto LAB_00616134;
      }
      uVar11 = uVar10 >> 5 & 0xf;
      local_48 = cs;
      uVar13 = regime_el(env,mmu_idx);
      uVar26 = *(uint32_t *)((long)((env->cp15).tcr_el + 5) + ((ulong)(uVar13 != 1) * 2 + 2) * 4) >>
               (char)uVar11 * '\x02';
      uVar14 = uVar10 & 3;
      if (uVar14 == 0) {
        iVar12 = 1;
        goto switchD_006167d0_caseD_0;
      }
      if (uVar14 == 2) {
        iVar12 = 1;
        if ((uVar26 & 1) == 0) {
LAB_006164af:
          AVar22 = ARMFault_Domain;
          goto LAB_00616131;
        }
LAB_00616624:
        uVar20 = uVar20 & 0xfffff | uVar10 & 0xfff00000;
        uVar14 = uVar10 >> 10;
        *page_size = 0x100000;
      }
      else {
        if ((uVar26 & 1) == 0) {
          iVar12 = 2;
          goto LAB_006164af;
        }
        iVar12 = 2;
        if (uVar14 == 2) goto LAB_00616624;
        local_70 = uVar10 & 3;
        bVar34 = uVar14 == 1;
        uVar14 = 0xfffff000;
        if (bVar34) {
          uVar14 = 0xfffffc00;
        }
        uVar27 = 0xffc;
        if (bVar34) {
          uVar27 = 0x3fc;
        }
        if ((0x36 < uVar24) || ((0x7f8000000387ffU >> (uVar15 & 0x3f) & 1) == 0)) goto LAB_00616aea;
        uVar10 = arm_ldl_ptw(local_48,(ulong)(uVar20 >> (bVar34 * '\x02' | 8U) & uVar27 |
                                             uVar14 & uVar10),
                             (0x787ffffffc7bc0U >> (uVar15 & 0x3f) & 1) != 0,mmu_idx,fi);
        iVar33 = 2;
        iVar12 = 2;
        if (fi->type != ARMFault_None) goto LAB_00616134;
        iVar12 = iVar33;
        switch(uVar10 & 3) {
        case 0:
switchD_006167d0_caseD_0:
          AVar22 = ARMFault_Translation;
          goto LAB_00616131;
        case 1:
          bVar19 = (byte)(uVar20 >> 0xd);
          uVar20 = uVar20 & 0xffff | uVar10 & 0xffff0000;
          *page_size = 0x10000;
          break;
        case 2:
          bVar19 = (byte)(uVar20 >> 9);
          uVar20 = uVar20 & 0xfff | uVar10 & 0xfffff000;
          *page_size = 0x1000;
          break;
        case 3:
          if (local_70 == 1) {
            if ((env->features & 10) == 0) goto switchD_006167d0_caseD_0;
            tVar18 = 0x1000;
            uVar14 = 0xfff;
            uVar27 = 0xfffff000;
          }
          else {
            tVar18 = 0x400;
            uVar14 = 0x3ff;
            uVar27 = 0xfffffc00;
          }
          uVar20 = uVar14 & uVar20 | uVar27 & uVar10;
          *page_size = tVar18;
          uVar14 = uVar10 >> 4;
          goto LAB_00616641;
        }
        uVar14 = uVar10 >> (bVar19 & 6) + 4;
      }
LAB_00616641:
      if (uVar24 < 0x36) {
        bVar19 = 1;
        if ((0x2a800000008041U >> (uVar15 & 0x3f) & 1) == 0) {
          if ((6UL >> (uVar15 & 0x3f) & 1) != 0) goto LAB_00615bdc;
          goto LAB_00616a05;
        }
      }
      else {
LAB_00616a05:
        bVar19 = 0;
      }
      uVar27 = 4;
      uVar24 = 3;
      if ((uVar26 & 3) != 3) {
        switch(uVar14 & 3) {
        case 0:
          if ((env->features & 0x20) == 0) {
            uVar10 = regime_el(env,mmu_idx);
            uVar24 = (uint)(env->cp15).cptr_el[(ulong)uVar10 - 5] & 0x300;
            if (uVar24 == 0x200) {
              uVar24 = 1;
            }
            else {
              if (uVar24 != 0x100) goto LAB_0061687d;
              uVar24 = (uint)(bVar19 ^ 1);
              uVar27 = (uint)(bVar19 ^ 1) * 4;
            }
          }
          else {
LAB_0061687d:
            uVar24 = 0;
            uVar27 = 0;
          }
          break;
        case 1:
          if (bVar19 != 0) goto LAB_0061687d;
          break;
        case 2:
          uVar24 = (uint)(bVar19 ^ 1) * 2 + 1;
          break;
        case 3:
          uVar24 = uVar14 & 3;
        }
      }
      *prot = uVar24 | uVar27;
      if (((uVar24 | uVar27) >> (access_type & 0x1f) & 1) != 0) {
        *phys_ptr = (ulong)uVar20;
        return false;
      }
      AVar22 = ARMFault_Permission;
    }
    else {
      uVar11 = 0;
      iVar12 = 1;
    }
LAB_00616131:
    fi->type = AVar22;
LAB_00616134:
    fi->domain = uVar11;
    fi->level = iVar12;
    return true;
  }
  *page_size = puVar2->init_target_page->mask * -0x100000000 >> 0x20;
  uVar15 = env->features;
  if (((uint)uVar15 >> 0x1b & 1) != 0) {
    uVar11 = mmu_idx - ARMMMUIdx_E20_0;
    if ((uVar11 < 0x37) && ((0x7f8000000387ffU >> ((ulong)uVar11 & 0x3f) & 1) != 0)) {
      puVar2 = env->uc;
      if (((uVar15 >> 0x25 & 1) != 0) && ((0x787ffffffc7bc0U >> ((byte)uVar11 & 0x3f) & 1) == 0)) {
        fi->type = ARMFault_QEMU_SFault;
        *page_size = puVar2->init_target_page->mask * -0x100000000 >> 0x20;
        *phys_ptr = address & 0xffffffff;
        *prot = 0;
        return true;
      }
      _Var6 = pmsav8_mpu_lookup_aarch64
                        (env,uVar20,access_type,mmu_idx,phys_ptr,attrs,prot,(_Bool *)&ipa,fi,
                         (uint32_t *)0x0);
      tVar18 = 1;
      if ((char)ipa == '\0') {
        tVar18 = puVar2->init_target_page->mask * -0x100000000 >> 0x20;
      }
      *page_size = tVar18;
      return _Var6;
    }
    goto LAB_00616aea;
  }
  if ((uVar15 & 0x20) == 0) {
    uVar11 = mmu_idx - ARMMMUIdx_E20_0;
    if (uVar11 < 0x36) {
      bVar19 = 1;
      if ((0x2a800000008041U >> ((ulong)uVar11 & 0x3f) & 1) == 0) {
        if ((6UL >> ((ulong)uVar11 & 0x3f) & 1) != 0) goto LAB_00615bdc;
        goto LAB_006161f1;
      }
    }
    else {
LAB_006161f1:
      bVar19 = 0;
    }
    _Var6 = regime_translation_disabled(env,mmu_idx);
    *phys_ptr = address & 0xffffffff;
    if (_Var6) {
      *prot = 7;
      return false;
    }
    lVar16 = 0;
    do {
      uVar11 = *(uint *)((long)(env->cp15).c6_region + lVar16 + 0x1c);
      if (((uVar11 & 1) != 0) &&
         (((uVar11 ^ uVar20) >> ((byte)uVar11 >> 1 & 0x1f) & 0xfffffffe) == 0)) {
        iVar12 = 7;
        switch((env->cp15).c6_region[(ulong)(access_type == MMU_INST_FETCH) - 0x12] >>
               ((char)lVar16 + 0x1cU & 0x1f) & 0xf) {
        default:
          goto switchD_00615ddf_caseD_0;
        case 2:
          iVar12 = (uint)(bVar19 ^ 1) * 2 + 5;
          break;
        case 3:
          break;
        case 5:
          iVar12 = 5;
        case 1:
          if (bVar19 != 0) {
switchD_00615ddf_caseD_0:
            fi->type = ARMFault_Permission;
            fi->level = 1;
            return true;
          }
          break;
        case 6:
          iVar12 = 5;
        }
        *prot = iVar12;
        return false;
      }
      lVar16 = lVar16 + -4;
    } while (lVar16 != -0x20);
    goto LAB_006161d6;
  }
  puVar2 = env->uc;
  uVar11 = mmu_idx - ARMMMUIdx_E20_0;
  if (uVar11 < 0x36) {
    _Var6 = true;
    if ((0x2a800000008041U >> ((ulong)uVar11 & 0x3f) & 1) == 0) {
      if ((6UL >> ((ulong)uVar11 & 0x3f) & 1) != 0) goto LAB_00615bdc;
      goto LAB_00616207;
    }
  }
  else {
LAB_00616207:
    _Var6 = false;
  }
  local_48 = (CPUState *)(address & 0xffffffff);
  *phys_ptr = (hwaddr)local_48;
  *page_size = puVar2->init_target_page->mask * -0x100000000 >> 0x20;
  *prot = 0;
  _Var8 = regime_translation_disabled(env,mmu_idx);
  uVar11 = (uint)env->features;
  if (!_Var8) {
    if (((uVar20 & 0xfff00000) == 0xe0000000 & (byte)(uVar11 >> 9) & 1) != 0) {
LAB_00615b26:
      uVar11 = 7;
      if ((((0x3fffffff < uVar20 + 0xa0000000) && (0x1fffffff < uVar20)) &&
          (uVar24 = uVar20 & 0xe0000000, uVar24 != 0x20000000)) &&
         (((uVar11 = 3, uVar20 < 0xe0000000 && (uVar24 != 0xc0000000)) &&
          (((int)uVar20 < 0x40000000 && (uVar24 != 0xa0000000)))))) goto LAB_0061641f;
      goto LAB_0061641c;
    }
    iVar12 = *(int *)((long)env[1].xregs + 0x1c);
    uVar15 = (ulong)(iVar12 - 1U);
    if (0 < iVar12) {
      puVar3 = (env->pmsav7).drbar;
      puVar4 = (env->pmsav7).drsr;
      uVar15 = (ulong)(iVar12 - 1U);
      do {
        uVar11 = puVar4[uVar15];
        uVar24 = uVar11 >> 1 & 0x1f;
        if (uVar24 != 0 && (uVar11 & 1) != 0) {
          uVar14 = uVar24 + 1;
          uVar26 = puVar3[uVar15];
          uVar27 = ~(uint)(-1L << (sbyte)uVar14);
          if ((uVar26 & uVar27) == 0) {
            if ((uVar26 <= uVar20) && (uVar20 <= uVar26 + uVar27)) {
              if (uVar24 < 7) {
                uVar26 = puVar2->init_target_page->bits;
              }
              else {
                uVar24 = uVar24 - 2;
                uVar31 = uVar20 - uVar26 >> ((byte)uVar24 & 0x1f) & 7;
                uVar29 = 0x100 << (sbyte)uVar31;
                uVar27 = (uint)((uVar29 & uVar11) != 0) * 3;
                uVar26 = puVar2->init_target_page->bits;
                uVar30 = uVar24;
                if (uVar24 < uVar26) {
                  uVar30 = uVar26;
                }
                uVar32 = 2;
                do {
                  uVar5 = uVar30;
                  if (uVar26 <= uVar24) break;
                  uVar21 = -uVar32 & uVar31 | 8;
                  if (0x20 - uVar21 < uVar32) {
                    __assert_fail("start >= 0 && length > 0 && length <= 32 - start",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                                  ,0x11f,"uint32_t extract32(uint32_t, int, int)");
                  }
                  bVar19 = -(byte)uVar32;
                  uVar5 = uVar24;
                  if (uVar27 != ((uVar11 >> (sbyte)uVar21) << (bVar19 & 0x1f)) >> (bVar19 & 0x1f))
                  break;
                  uVar24 = uVar24 + 1;
                  uVar27 = uVar27 | uVar27 << ((byte)uVar32 & 0x1f);
                  bVar34 = uVar32 < 5;
                  uVar32 = uVar32 * 2;
                  uVar5 = uVar14;
                } while (bVar34);
                uVar14 = uVar5;
                if ((uVar29 & uVar11) != 0) goto LAB_00615d81;
              }
              if (uVar14 < uVar26) {
                *page_size = 1L << ((byte)uVar14 & 0x3f);
              }
              goto LAB_0061614f;
            }
            lVar16 = puVar2->init_target_page->mask;
            uVar23 = (ulong)((uint)lVar16 & (uint)local_48);
            if ((uVar23 <= ((ulong)uVar27 + (ulong)uVar26) - 1) &&
               ((ulong)uVar26 <= ((lVar16 * -0x100000000 >> 0x20) + uVar23) - 1)) {
              *page_size = 1;
            }
          }
        }
LAB_00615d81:
        bVar34 = 0 < (long)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar34);
LAB_006161ab:
      _Var6 = pmsav7_use_background_region
                        ((ARMCPU_conflict1 *)(env[-4].vfp.zregs[0x17].d + 0x14),mmu_idx,_Var6);
      if (!_Var6) {
LAB_006161d6:
        fi->type = ARMFault_Background;
        return true;
      }
      if ((env->features & 0x200) == 0) goto LAB_00615875;
      goto LAB_00615b26;
    }
    if (iVar12 == 0) goto LAB_006161ab;
LAB_0061614f:
    uVar11 = (env->pmsav7).dracr[(int)uVar15];
    uVar14 = uVar11 >> 8 & 7;
    uVar24 = (uint)env->features;
    if (_Var6 == false) {
      if (uVar14 - 1 < 3) goto switchD_006161a9_caseD_3;
      if (uVar14 - 5 < 2) goto switchD_006161a9_caseD_2;
      if (uVar14 == 7) goto switchD_006161a9_caseD_7;
    }
    else {
      switch(uVar14) {
      case 3:
switchD_006161a9_caseD_3:
        *(byte *)prot = (byte)*prot | 2;
      case 2:
      case 6:
switchD_006161a9_caseD_2:
        *(byte *)prot = (byte)*prot | 5;
        break;
      case 7:
switchD_006161a9_caseD_7:
        if ((uVar24 >> 9 & 1) != 0) goto switchD_006161a9_caseD_2;
      }
    }
    if (0xdfffffff < uVar20 && (uVar24 >> 9 & 1) != 0 || (uVar11 >> 0xc & 1) != 0) {
      uVar11 = *prot & 0xfffffffb;
LAB_0061641c:
      *prot = uVar11;
    }
LAB_0061641f:
    fi->type = ARMFault_Permission;
    fi->level = 1;
    return ((uint)*prot >> (access_type & 0x1f) & 1) == 0;
  }
  if ((uVar11 >> 9 & 1) != 0) goto LAB_00615b26;
LAB_00615875:
  *prot = 3;
  if (uVar20 < 0xf0000000) {
    uVar11 = 7;
    if ((int)uVar20 < 0) goto LAB_0061641f;
  }
  else {
    uVar10 = regime_el(env,mmu_idx);
    if ((*(byte *)((long)(env->cp15).cptr_el + (ulong)uVar10 * 8 + -0x27) & 0x20) == 0)
    goto LAB_0061641f;
    uVar11 = *prot | 4;
  }
  goto LAB_0061641c;
}

Assistant:

bool get_phys_addr(CPUARMState *env, target_ulong address,
                   MMUAccessType access_type, ARMMMUIdx mmu_idx,
                   hwaddr *phys_ptr, MemTxAttrs *attrs, int *prot,
                   target_ulong *page_size,
                   ARMMMUFaultInfo *fi, ARMCacheAttrs *cacheattrs)
{
    struct uc_struct *uc = env->uc;
    if (mmu_idx == ARMMMUIdx_E10_0 ||
        mmu_idx == ARMMMUIdx_E10_1 ||
        mmu_idx == ARMMMUIdx_E10_1_PAN) {
        /* Call ourselves recursively to do the stage 1 and then stage 2
         * translations.
         */
        if (arm_feature(env, ARM_FEATURE_EL2)) {
            hwaddr ipa;
            int s2_prot;
            int ret;
            ARMCacheAttrs cacheattrs2 = { 0 };

            ret = get_phys_addr(env, address, access_type,
                                stage_1_mmu_idx(mmu_idx), &ipa, attrs,
                                prot, page_size, fi, cacheattrs);

            /* If S1 fails or S2 is disabled, return early.  */
            if (ret || regime_translation_disabled(env, ARMMMUIdx_Stage2)) {
                *phys_ptr = ipa;
                return ret;
            }

            /* S1 is done. Now do S2 translation.  */
            ret = get_phys_addr_lpae(env, ipa, access_type, ARMMMUIdx_Stage2,
                                     phys_ptr, attrs, &s2_prot,
                                     page_size, fi,
                                     cacheattrs != NULL ? &cacheattrs2 : NULL);
            fi->s2addr = ipa;
            /* Combine the S1 and S2 perms.  */
            *prot &= s2_prot;

            /* Combine the S1 and S2 cache attributes, if needed */
            if (!ret && cacheattrs != NULL) {
                if (env->cp15.hcr_el2 & HCR_DC) {
                    /*
                     * HCR.DC forces the first stage attributes to
                     *  Normal Non-Shareable,
                     *  Inner Write-Back Read-Allocate Write-Allocate,
                     *  Outer Write-Back Read-Allocate Write-Allocate.
                     */
                    cacheattrs->attrs = 0xff;
                    cacheattrs->shareability = 0;
                }
                *cacheattrs = combine_cacheattrs(*cacheattrs, cacheattrs2);
            }

            return ret;
        } else {
            /*
             * For non-EL2 CPUs a stage1+stage2 translation is just stage 1.
             */
            mmu_idx = stage_1_mmu_idx(mmu_idx);
        }
    }

    /* The page table entries may downgrade secure to non-secure, but
     * cannot upgrade an non-secure translation regime's attributes
     * to secure.
     */
    attrs->secure = regime_is_secure(env, mmu_idx);
    attrs->user = regime_is_user(env, mmu_idx);

    /* Fast Context Switch Extension. This doesn't exist at all in v8.
     * In v7 and earlier it affects all stage 1 translations.
     */
    if (address < 0x02000000 && mmu_idx != ARMMMUIdx_Stage2
        && !arm_feature(env, ARM_FEATURE_V8)) {
        if (regime_el(env, mmu_idx) == 3) {
            address += env->cp15.fcseidr_s;
        } else {
            address += env->cp15.fcseidr_ns;
        }
    }

    if (arm_feature(env, ARM_FEATURE_PMSA)) {
        bool ret;
        *page_size = TARGET_PAGE_SIZE;

        if (arm_feature(env, ARM_FEATURE_V8)) {
            /* PMSAv8 */
            ret = get_phys_addr_pmsav8(env, address, access_type, mmu_idx,
                                       phys_ptr, attrs, prot, page_size, fi);
        } else if (arm_feature(env, ARM_FEATURE_V7)) {
            /* PMSAv7 */
            ret = get_phys_addr_pmsav7(env, address, access_type, mmu_idx,
                                       phys_ptr, prot, page_size, fi);
        } else {
            /* Pre-v7 MPU */
            ret = get_phys_addr_pmsav5(env, address, access_type, mmu_idx,
                                       phys_ptr, prot, fi);
        }
        qemu_log_mask(CPU_LOG_MMU, "PMSA MPU lookup for %s at 0x%08" PRIx32
                      " mmu_idx %u -> %s (prot %c%c%c)\n",
                      access_type == MMU_DATA_LOAD ? "reading" :
                      (access_type == MMU_DATA_STORE ? "writing" : "execute"),
                      (uint32_t)address, mmu_idx,
                      ret ? "Miss" : "Hit",
                      *prot & PAGE_READ ? 'r' : '-',
                      *prot & PAGE_WRITE ? 'w' : '-',
                      *prot & PAGE_EXEC ? 'x' : '-');

        return ret;
    }

    /* Definitely a real MMU, not an MPU */

    if (regime_translation_disabled(env, mmu_idx)) {
        /*
         * MMU disabled.  S1 addresses within aa64 translation regimes are
         * still checked for bounds -- see AArch64.TranslateAddressS1Off.
         */
        if (mmu_idx != ARMMMUIdx_Stage2) {
            int r_el = regime_el(env, mmu_idx);
            if (arm_el_is_aa64(env, r_el)) {
                int pamax = arm_pamax(env_archcpu(env));
                uint64_t tcr = env->cp15.tcr_el[r_el].raw_tcr;
                int addrtop, tbi;

                tbi = aa64_va_parameter_tbi(tcr, mmu_idx);
                if (access_type == MMU_INST_FETCH) {
                    tbi &= ~aa64_va_parameter_tbid(tcr, mmu_idx);
                }
                tbi = (tbi >> extract64(address, 55, 1)) & 1;
                addrtop = (tbi ? 55 : 63);

                if (extract64(address, pamax, addrtop - pamax + 1) != 0) {
                    fi->type = ARMFault_AddressSize;
                    fi->level = 0;
                    fi->stage2 = false;
                    return 1;
                }

                /*
                 * When TBI is disabled, we've just validated that all of the
                 * bits above PAMax are zero, so logically we only need to
                 * clear the top byte for TBI.  But it's clearer to follow
                 * the pseudocode set of addrdesc.paddress.
                 */
                address = extract64(address, 0, 52);
            }
        }
        *phys_ptr = address;
        *prot = PAGE_READ | PAGE_WRITE | PAGE_EXEC;
        *page_size = TARGET_PAGE_SIZE;
        return 0;
    }

    if (regime_using_lpae_format(env, mmu_idx)) {
        return get_phys_addr_lpae(env, address, access_type, mmu_idx,
                                  phys_ptr, attrs, prot, page_size,
                                  fi, cacheattrs);
    } else if (regime_sctlr(env, mmu_idx) & SCTLR_XP) {
        return get_phys_addr_v6(env, address, access_type, mmu_idx,
                                phys_ptr, attrs, prot, page_size, fi);
    } else {
        return get_phys_addr_v5(env, address, access_type, mmu_idx,
                                    phys_ptr, prot, page_size, fi);
    }
}